

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O2

bool __thiscall
PruneReplayer::enqueue_create_raytracing_pipeline
          (PruneReplayer *this,Hash hash,VkRayTracingPipelineCreateInfoKHR *create_info,
          VkPipeline *pipeline)

{
  Hash *pHVar1;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_00;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  VkPipelineLibraryCreateInfoKHR *pVVar6;
  size_type sVar7;
  mapped_type *ppVVar8;
  bool bVar9;
  ulong uVar10;
  long lVar11;
  VkPipeline local_50;
  PruneReplayer *local_48;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  Hash hash_local;
  
  *pipeline = (VkPipeline)hash;
  hash_local = hash;
  bVar3 = filter_object(this,RESOURCE_RAYTRACING_PIPELINE,hash);
  if (bVar3) {
    lVar11 = 0x18;
    uVar10 = 0xffffffffffffffff;
    do {
      uVar4 = create_info->stageCount;
      uVar10 = uVar10 + 1;
      if (uVar4 <= uVar10) {
        bVar3 = false;
        goto LAB_00107572;
      }
      pHVar1 = (Hash *)((long)&create_info->pStages->sType + lVar11);
      lVar11 = lVar11 + 0x30;
      bVar3 = filter_shader_module(this,*pHVar1);
    } while (!bVar3);
    uVar4 = create_info->stageCount;
    bVar3 = true;
LAB_00107572:
    if (uVar4 == 0) {
      bVar3 = true;
    }
    lVar11 = 0x18;
    uVar10 = 0xffffffffffffffff;
    local_48 = this;
    do {
      uVar10 = uVar10 + 1;
      if (create_info->stageCount <= uVar10) goto LAB_001075c5;
      local_50 = *(VkPipeline *)((long)&create_info->pStages->sType + lVar11);
      lVar11 = lVar11 + 0x30;
      sVar5 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(this->banned_modules)._M_h,(key_type *)&local_50);
    } while (sVar5 == 0);
    bVar3 = false;
LAB_001075c5:
    pVVar6 = create_info->pLibraryInfo;
    if (pVVar6 != (VkPipelineLibraryCreateInfoKHR *)0x0) {
      this_00 = &local_48->banned_raytracing;
      local_40 = &(local_48->raytracing_pipelines)._M_h;
      bVar9 = false;
      for (uVar10 = 0; uVar10 < pVVar6->libraryCount; uVar10 = uVar10 + 1) {
        local_50 = pVVar6->pLibraries[uVar10];
        sVar5 = std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&this_00->_M_h,(key_type *)&local_50);
        if (sVar5 != 0) {
          bVar3 = false;
          break;
        }
        if (!bVar9) {
          local_50 = create_info->pLibraryInfo->pLibraries[uVar10];
          sVar7 = std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count(local_40,(key_type *)&local_50);
          if (sVar7 != 0) {
            bVar9 = true;
          }
        }
        bVar2 = bVar9;
        if (!bVar3) {
          bVar2 = bVar3;
        }
        if (create_info->stageCount != 0) {
          bVar2 = bVar3;
        }
        bVar3 = bVar2;
        pVVar6 = create_info->pLibraryInfo;
      }
    }
    uVar4 = create_info->flags & 0x800;
    if ((uVar4 != 0) && (create_info->stageCount == 0)) {
      bVar3 = false;
    }
    lVar11 = 0x3f8;
    this = local_48;
    if (bVar3) goto LAB_0010769c;
  }
  else {
    uVar4 = create_info->flags & 0x800;
  }
  lVar11 = 0x468;
  if (uVar4 == 0) {
    return true;
  }
LAB_0010769c:
  ppVVar8 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)((long)&(this->super_StateCreatorInterface)._vptr_StateCreatorInterface
                            + lVar11),&hash_local);
  *ppVVar8 = create_info;
  return true;
}

Assistant:

bool enqueue_create_raytracing_pipeline(Hash hash, const VkRayTracingPipelineCreateInfoKHR *create_info, VkPipeline *pipeline) override
	{
		*pipeline = fake_handle<VkPipeline>(hash);
		bool allow_pipeline = false;

		if (filter_object(RESOURCE_RAYTRACING_PIPELINE, hash))
		{
			for (uint32_t i = 0; i < create_info->stageCount; i++)
			{
				if (filter_shader_module((Hash) create_info->pStages[i].module))
				{
					allow_pipeline = true;
					break;
				}
			}

			if (create_info->stageCount == 0)
				allow_pipeline = true;

			// Need to test this as well, if there is at least one banned module used, we don't allow the pipeline.
			for (uint32_t i = 0; i < create_info->stageCount; i++)
			{
				if (banned_modules.count((Hash) create_info->pStages[i].module))
				{
					allow_pipeline = false;
					break;
				}
			}

			if (create_info->pLibraryInfo)
			{
				bool has_default_allowed_library = false;
				for (uint32_t i = 0; i < create_info->pLibraryInfo->libraryCount; i++)
				{
					if (banned_raytracing.count((Hash) create_info->pLibraryInfo->pLibraries[i]))
					{
						allow_pipeline = false;
						break;
					}

					if (!has_default_allowed_library &&
					    raytracing_pipelines.count((Hash) create_info->pLibraryInfo->pLibraries[i]))
					{
						has_default_allowed_library = true;
					}

					// At least one of the dependent libraries must be considered allowed to pass.
					if (create_info->stageCount == 0 && allow_pipeline)
						allow_pipeline = has_default_allowed_library;
				}
			}

			// Never include libraries by default unless they contain real code.
			if ((create_info->flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0 && create_info->stageCount == 0)
				allow_pipeline = false;
		}

		// Need to defer this since we need to access pipeline libraries.
		if (allow_pipeline)
			raytracing_pipelines[hash] = create_info;
		else if ((create_info->flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0)
			library_raytracing_pipelines[hash] = create_info;

		return true;
	}